

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_posix.h
# Opt level: O0

kbool_t LoadPlatformModule(KonohaFactory *factory,char *moduleName,ModuleType type)

{
  kbool_t kVar1;
  byte bVar2;
  long lVar3;
  code *pcVar4;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ModuleLoadFunc load;
  char funcbuf [256];
  void *gluehdr;
  char pathbuf [4096];
  char local_1138 [8];
  char *in_stack_ffffffffffffeed0;
  char *in_stack_ffffffffffffeed8;
  size_t in_stack_ffffffffffffeee0;
  char *in_stack_ffffffffffffeee8;
  KonohaFactory *in_stack_ffffffffffffeef0;
  undefined1 local_1028 [4108];
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  kVar1 = FormatModulePath(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,
                           in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                           in_stack_ffffffffffffeed0);
  if ((kVar1) && (lVar3 = dlopen(local_1028,1), lVar3 != 0)) {
    snprintf(local_1138,0x100,"Load%sModule",local_18);
    pcVar4 = (code *)dlsym(lVar3,local_1138);
    if (pcVar4 != (code *)0x0) {
      bVar2 = (*pcVar4)(local_10,local_1c);
      return (kbool_t)(bVar2 & 1);
    }
  }
  return false;
}

Assistant:

static kbool_t LoadPlatformModule(KonohaFactory *factory, const char *moduleName, ModuleType type)
{
	char pathbuf[K_PATHMAX];
	if(FormatModulePath(factory, pathbuf, sizeof(pathbuf), moduleName, K_OSDLLEXT)) {
		void *gluehdr = dlopen(pathbuf, RTLD_LAZY);  // don't close until the program ends
		if(gluehdr != NULL) {
			char funcbuf[256];
			snprintf(funcbuf, sizeof(funcbuf), "Load%sModule", moduleName);
			ModuleLoadFunc load = (ModuleLoadFunc)dlsym(gluehdr, funcbuf);
			if(load != NULL) {
				return load(factory, type);
			}
		}
	}
	return false;
}